

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::ParseWindowsCommandLine
               (char *command,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  uint uVar2;
  int backslash_escaped;
  int backslash_pairs;
  char *c;
  string arg;
  int backslashes;
  bool in_quotes;
  bool in_argument;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  char *command_local;
  
  arg.field_2._M_local_buf[0xf] = '\0';
  arg.field_2._M_local_buf[0xe] = '\0';
  arg.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)&c);
  for (_backslash_escaped = command; *_backslash_escaped != '\0';
      _backslash_escaped = _backslash_escaped + 1) {
    if (*_backslash_escaped == '\\') {
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
      arg.field_2._M_local_buf[0xf] = '\x01';
    }
    else if (*_backslash_escaped == '\"') {
      uVar2 = arg.field_2._8_4_ & 1;
      std::__cxx11::string::append((ulong)&c,(char)((int)arg.field_2._8_4_ >> 1));
      arg.field_2._8_4_ = 0;
      if (uVar2 == 0) {
        arg.field_2._M_local_buf[0xe] = (arg.field_2._M_local_buf[0xe] ^ 0xffU) & 1;
      }
      else {
        std::__cxx11::string::append((ulong)&c,'\x01');
      }
      arg.field_2._M_local_buf[0xf] = '\x01';
    }
    else {
      std::__cxx11::string::append((ulong)&c,(char)arg.field_2._8_4_);
      arg.field_2._8_4_ = 0;
      bVar1 = cmIsSpace(*_backslash_escaped);
      if (bVar1) {
        if ((arg.field_2._M_local_buf[0xe] & 1U) == 0) {
          if ((arg.field_2._M_local_buf[0xf] & 1U) != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)&c);
            std::__cxx11::string::clear();
            arg.field_2._M_local_buf[0xf] = '\0';
          }
        }
        else {
          std::__cxx11::string::append((ulong)&c,'\x01');
        }
      }
      else {
        arg.field_2._M_local_buf[0xf] = '\x01';
        std::__cxx11::string::append((ulong)&c,'\x01');
      }
    }
  }
  std::__cxx11::string::append((ulong)&c,(char)arg.field_2._8_4_);
  if ((arg.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,(value_type *)&c);
  }
  std::__cxx11::string::~string((string *)&c);
  return;
}

Assistant:

void cmSystemTools::ParseWindowsCommandLine(const char* command,
                                            std::vector<std::string>& args)
{
  // See the MSDN document "Parsing C Command-Line Arguments" at
  // http://msdn2.microsoft.com/en-us/library/a1y7w461.aspx for rules
  // of parsing the windows command line.

  bool in_argument = false;
  bool in_quotes = false;
  int backslashes = 0;
  std::string arg;
  for (const char* c = command; *c; ++c) {
    if (*c == '\\') {
      ++backslashes;
      in_argument = true;
    } else if (*c == '"') {
      int backslash_pairs = backslashes >> 1;
      int backslash_escaped = backslashes & 1;
      arg.append(backslash_pairs, '\\');
      backslashes = 0;
      if (backslash_escaped) {
        /* An odd number of backslashes precede this quote.
           It is escaped.  */
        arg.append(1, '"');
      } else {
        /* An even number of backslashes precede this quote.
           It is not escaped.  */
        in_quotes = !in_quotes;
      }
      in_argument = true;
    } else {
      arg.append(backslashes, '\\');
      backslashes = 0;
      if (cmIsSpace(*c)) {
        if (in_quotes) {
          arg.append(1, *c);
        } else if (in_argument) {
          args.push_back(arg);
          arg.clear();
          in_argument = false;
        }
      } else {
        in_argument = true;
        arg.append(1, *c);
      }
    }
  }
  arg.append(backslashes, '\\');
  if (in_argument) {
    args.push_back(arg);
  }
}